

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O0

bool TasOptimization::testParticleSwarm(bool verbose)

{
  allocator<double> *this;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  bool bVar1;
  DreamDomain local_5a8;
  ParticleSwarmState local_588;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  local_4b0;
  function<double_()> local_490;
  ParticleSwarmState local_470;
  function<double_(const_std::vector<double,_std::allocator<double>_>_&)> local_398;
  undefined1 local_378 [8];
  ObjectiveFunction shc;
  undefined1 local_350 [8];
  ObjectiveFunctionSingle shc_single;
  double local_310 [2];
  iterator local_300;
  undefined8 local_2f8;
  DreamDomain local_2f0;
  ParticleSwarmState local_2d0;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  local_1f8;
  function<double_()> local_1d8;
  undefined1 local_1b8 [8];
  ParticleSwarmState state;
  undefined1 local_c0 [8];
  ObjectiveFunction l1;
  undefined1 local_98 [8];
  ObjectiveFunctionSingle l1_single;
  value_type_conflict1 local_70;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> upper;
  allocator<double> local_39;
  value_type_conflict1 local_38;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> lower;
  int iterations;
  int num_particles;
  int num_dimensions;
  test_result test;
  bool verbose_local;
  
  num_particles._3_1_ = verbose;
  test_result::test_result((test_result *)((long)&num_particles + 1));
  lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 100;
  lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 300;
  local_38 = -5.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,6,&local_38,&local_39);
  std::allocator<double>::~allocator(&local_39);
  local_70 = 2.0;
  this = (allocator<double> *)((long)&l1_single._M_invoker + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,6,&local_70,this);
  std::allocator<double>::~allocator((allocator<double> *)((long)&l1_single._M_invoker + 7));
  std::function<double(std::vector<double,std::allocator<double>>const&)>::
  function<TasOptimization::testParticleSwarm(bool)::__0,void>
            ((function<double(std::vector<double,std::allocator<double>>const&)> *)local_98,
             (anon_class_1_0_00000001 *)((long)&l1._M_invoker + 7));
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)
             &state.cache_best_particle_inside.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,
             (function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_98);
  makeObjectiveFunction
            ((ObjectiveFunction *)local_c0,6,
             (ObjectiveFunctionSingle *)
             &state.cache_best_particle_inside.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)
             &state.cache_best_particle_inside.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  TasOptimization::ParticleSwarmState::ParticleSwarmState
            ((ParticleSwarmState *)local_1b8,6,
             lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  std::function<double()>::function<double(&)(),void>
            ((function<double()> *)&local_1d8,TasDREAM::tsgCoreUniform01);
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
            (local_1b8,local_30,local_68,&local_1d8);
  std::function<double_()>::~function(&local_1d8);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_1f8,
             (function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)local_c0);
  ParticleSwarmState::ParticleSwarmState(&local_2d0,(ParticleSwarmState *)local_1b8);
  TasDREAM::hypercube(&local_2f0,(vector<double,_std::allocator<double>_> *)local_30,
                      (vector<double,_std::allocator<double>_> *)local_68);
  bVar1 = testParticleSwarmSingle
                    (&local_1f8,&local_2d0,&local_2f0,
                     (int)lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0.0);
  test_result::tassert((test_result *)((long)&num_particles + 1),bVar1);
  std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function(&local_2f0);
  ParticleSwarmState::~ParticleSwarmState(&local_2d0);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function(&local_1f8);
  bVar1 = test_result::failed_last((test_result *)((long)&num_particles + 1));
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,
                    "ERROR: failed l1 example for Particle Swarm optimization.\n");
  }
  lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x32;
  lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 100;
  local_310[0] = -3.0;
  local_310[1] = -2.0;
  local_300 = local_310;
  local_2f8 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_300;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_30,__l_00);
  shc_single._M_invoker = (_Invoker_type)0x4008000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&shc_single._M_invoker;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_68,__l);
  std::function<double(std::vector<double,std::allocator<double>>const&)>::
  function<TasOptimization::testParticleSwarm(bool)::__1,void>
            ((function<double(std::vector<double,std::allocator<double>>const&)> *)local_350,
             (anon_class_1_0_00000001 *)((long)&shc._M_invoker + 7));
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            (&local_398,
             (function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_350);
  makeObjectiveFunction((ObjectiveFunction *)local_378,2,&local_398);
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
            (&local_398);
  TasOptimization::ParticleSwarmState::ParticleSwarmState
            (&local_470,2,
             lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  ParticleSwarmState::operator=((ParticleSwarmState *)local_1b8,&local_470);
  ParticleSwarmState::~ParticleSwarmState(&local_470);
  std::function<double()>::function<double(&)(),void>
            ((function<double()> *)&local_490,TasDREAM::tsgCoreUniform01);
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
            ((ParticleSwarmState *)local_1b8,local_30,local_68,&local_490);
  std::function<double_()>::~function(&local_490);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_4b0,
             (function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)local_378);
  ParticleSwarmState::ParticleSwarmState(&local_588,(ParticleSwarmState *)local_1b8);
  TasDREAM::hypercube(&local_5a8,(vector<double,_std::allocator<double>_> *)local_30,
                      (vector<double,_std::allocator<double>_> *)local_68);
  bVar1 = testParticleSwarmSingle
                    (&local_4b0,&local_588,&local_5a8,
                     (int)lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,-1.031628453489877);
  test_result::tassert((test_result *)((long)&num_particles + 1),bVar1);
  std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function(&local_5a8);
  ParticleSwarmState::~ParticleSwarmState(&local_588);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function(&local_4b0);
  bVar1 = test_result::failed_last((test_result *)((long)&num_particles + 1));
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,
                    "ERROR: failed l1 example for Particle Swarm optimization.\n");
  }
  bVar1 = test_result::failed_any((test_result *)((long)&num_particles + 1));
  if ((bVar1) || ((num_particles._3_1_ & 1) != 0)) {
    bVar1 = test_result::success((test_result *)((long)&num_particles + 1));
    reportPassFail(bVar1,"Particle Swarm","Algorithm Unit Tests");
  }
  bVar1 = test_result::success((test_result *)((long)&num_particles + 1));
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
               *)local_378);
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_350);
  ParticleSwarmState::~ParticleSwarmState((ParticleSwarmState *)local_1b8);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
               *)local_c0);
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)local_98);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return bVar1;
}

Assistant:

bool testParticleSwarm(bool verbose) {
    test_result test;

    // l1 norm over the domain [-5, 2] ^ 6.
    int num_dimensions = 6;
    int num_particles = 100;
    int iterations = 300;
    std::vector<double> lower(num_dimensions, -5.0);
    std::vector<double> upper(num_dimensions, 2.0);
    TasOptimization::ObjectiveFunctionSingle l1_single =
            [](const std::vector<double> &x)->double {
                double sum = 0;
                for (auto xi : x) sum += std::fabs(xi);
                return sum;
            };
    TasOptimization::ObjectiveFunction l1 = TasOptimization::makeObjectiveFunction(num_dimensions, l1_single);
    TasOptimization::ParticleSwarmState state(num_dimensions, num_particles);
    state.initializeParticlesInsideBox(lower, upper);
    test.tassert( testParticleSwarmSingle(l1, state, TasDREAM::hypercube(lower, upper), iterations, 0) );
    if (test.failed_last()) std::cout << "ERROR: failed l1 example for Particle Swarm optimization.\n";

    // Six hump-camel function over the domain [-3, 3] x [-2, 2].
    num_dimensions = 2;
    num_particles = 50;
    iterations = 100;
    lower = {-3.0, -2.0};
    upper = {3.0, 2.0};
    TasOptimization::ObjectiveFunctionSingle shc_single =
            [](const std::vector<double> &x)->double {
                return (4.0 - 2.1 * x[0]*x[0] + x[0]*x[0]*x[0]*x[0] / 3.0) * x[0]*x[0] +
                        x[0] * x[1] +
                        (-4.0 + 4.0 * x[1]*x[1]) * x[1]*x[1];};
    TasOptimization::ObjectiveFunction shc = TasOptimization::makeObjectiveFunction(num_dimensions, shc_single);
    state = ParticleSwarmState(num_dimensions, num_particles);
    state.initializeParticlesInsideBox(lower, upper);
    test.tassert( testParticleSwarmSingle(shc, state, TasDREAM::hypercube(lower, upper), iterations, -1.031628453489877) );
    if (test.failed_last()) std::cout << "ERROR: failed l1 example for Particle Swarm optimization.\n";

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Particle Swarm", "Algorithm Unit Tests");
    return test.success();
}